

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::backwardSubsumptionCheck(SimpSolver *this,bool verbose)

{
  CRef cr_00;
  bool bVar1;
  int iVar2;
  Size SVar3;
  uint32_t uVar4;
  uint uVar5;
  Size SVar6;
  Lit l_00;
  Lit *pLVar7;
  Clause *pCVar8;
  vec<unsigned_int,_int> *pvVar9;
  Clause *other;
  int iVar10;
  bool local_a5;
  Lit local_78;
  int local_74;
  Lit l_1;
  int j;
  CRef *cs;
  vec<unsigned_int,_int> *_cs;
  int local_54;
  int local_50;
  int local_4c;
  int i;
  uint8_t local_41;
  Var best;
  lbool local_39;
  Clause *local_38;
  Clause *c;
  CRef cr;
  Lit l;
  int deleted_literals;
  int subsumed;
  int cnt;
  bool verbose_local;
  SimpSolver *this_local;
  
  deleted_literals = 0;
  l.x = 0;
  cr = 0;
  iVar2 = Solver::decisionLevel(&this->super_Solver);
  if (iVar2 != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x15a,"bool Minisat::SimpSolver::backwardSubsumptionCheck(bool)");
  }
  do {
    do {
      iVar2 = Queue<unsigned_int>::size(&this->subsumption_queue);
      bVar1 = true;
      if (iVar2 < 1) {
        iVar2 = this->bwdsub_assigns;
        SVar3 = vec<Minisat::Lit,_int>::size(&(this->super_Solver).trail);
        bVar1 = iVar2 < SVar3;
      }
      if (!bVar1) {
        return true;
      }
      if (((this->super_Solver).asynch_interrupt & 1U) != 0) {
        Queue<unsigned_int>::clear(&this->subsumption_queue,false);
        SVar3 = vec<Minisat::Lit,_int>::size(&(this->super_Solver).trail);
        this->bwdsub_assigns = SVar3;
        return true;
      }
      iVar2 = Queue<unsigned_int>::size(&this->subsumption_queue);
      if ((iVar2 == 0) &&
         (iVar2 = this->bwdsub_assigns,
         SVar3 = vec<Minisat::Lit,_int>::size(&(this->super_Solver).trail), iVar2 < SVar3)) {
        iVar2 = this->bwdsub_assigns;
        this->bwdsub_assigns = iVar2 + 1;
        pLVar7 = vec<Minisat::Lit,_int>::operator[](&(this->super_Solver).trail,iVar2);
        c._4_4_ = pLVar7->x;
        pCVar8 = ClauseAllocator::operator[](&(this->super_Solver).ca,this->bwdsub_tmpunit);
        pLVar7 = Clause::operator[](pCVar8,0);
        pLVar7->x = c._4_4_;
        pCVar8 = ClauseAllocator::operator[](&(this->super_Solver).ca,this->bwdsub_tmpunit);
        Clause::calcAbstraction(pCVar8);
        Queue<unsigned_int>::insert(&this->subsumption_queue,this->bwdsub_tmpunit);
      }
      c._0_4_ = Queue<unsigned_int>::peek(&this->subsumption_queue);
      Queue<unsigned_int>::pop(&this->subsumption_queue);
      local_38 = ClauseAllocator::operator[](&(this->super_Solver).ca,(uint)c);
      uVar4 = Clause::mark(local_38);
    } while (uVar4 != 0);
    if (((verbose) && (1 < (this->super_Solver).verbosity)) &&
       (iVar2 = deleted_literals + 1, iVar10 = deleted_literals % 1000, deleted_literals = iVar2,
       iVar10 == 0)) {
      uVar5 = Queue<unsigned_int>::size(&this->subsumption_queue);
      printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r",(ulong)uVar5,
             (ulong)(uint)l.x,(ulong)cr);
    }
    iVar2 = Clause::size(local_38);
    local_a5 = true;
    if (iVar2 < 2) {
      pLVar7 = Clause::operator[](local_38,0);
      best = pLVar7->x;
      local_39 = Solver::value(&this->super_Solver,(Lit)best);
      local_41 = l_True.value;
      local_a5 = lbool::operator==(&local_39,l_True);
    }
    if (local_a5 == false) {
      __assert_fail("c.size() > 1 || value(c[0]) == l_True",
                    "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                    ,0x173,"bool Minisat::SimpSolver::backwardSubsumptionCheck(bool)");
    }
    pLVar7 = Clause::operator[](local_38,0);
    local_4c = pLVar7->x;
    i = var((Lit)local_4c);
    for (local_50 = 1; iVar2 = local_50, iVar10 = Clause::size(local_38), iVar2 < iVar10;
        local_50 = local_50 + 1) {
      pLVar7 = Clause::operator[](local_38,local_50);
      local_54 = var((Lit)pLVar7->x);
      pvVar9 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
               ::operator[](&this->occurs,&local_54);
      SVar3 = vec<unsigned_int,_int>::size(pvVar9);
      pvVar9 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
               ::operator[](&this->occurs,&i);
      SVar6 = vec<unsigned_int,_int>::size(pvVar9);
      if (SVar3 < SVar6) {
        pLVar7 = Clause::operator[](local_38,local_50);
        i = var((Lit)pLVar7->x);
      }
    }
    pvVar9 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
             ::lookup(&this->occurs,&i);
    _l_1 = Minisat::vec::operator_cast_to_unsigned_int_((vec *)pvVar9);
    local_74 = 0;
    while ((iVar2 = local_74, SVar3 = vec<unsigned_int,_int>::size(pvVar9), iVar2 < SVar3 &&
           (uVar4 = Clause::mark(local_38), uVar4 == 0))) {
      pCVar8 = ClauseAllocator::operator[](&(this->super_Solver).ca,_l_1[local_74]);
      uVar4 = Clause::mark(pCVar8);
      if ((uVar4 == 0) && (_l_1[local_74] != (uint)c)) {
        if (this->subsumption_lim != -1) {
          pCVar8 = ClauseAllocator::operator[](&(this->super_Solver).ca,_l_1[local_74]);
          iVar2 = Clause::size(pCVar8);
          if (this->subsumption_lim <= iVar2) goto LAB_0011ffa9;
        }
        pCVar8 = local_38;
        other = ClauseAllocator::operator[](&(this->super_Solver).ca,_l_1[local_74]);
        local_78 = Clause::subsumes(pCVar8,other);
        bVar1 = Lit::operator==(&local_78,(Lit)0xfffffffe);
        if (bVar1) {
          l.x = l.x + 1;
          removeClause(this,_l_1[local_74]);
        }
        else {
          bVar1 = Lit::operator!=(&local_78,(Lit)0xffffffff);
          if (bVar1) {
            cr = cr + 1;
            cr_00 = _l_1[local_74];
            l_00 = operator~(local_78);
            bVar1 = strengthenClause(this,cr_00,l_00);
            if (!bVar1) {
              return false;
            }
            iVar2 = var(local_78);
            if (iVar2 == i) {
              local_74 = local_74 + -1;
            }
          }
        }
      }
LAB_0011ffa9:
      local_74 = local_74 + 1;
    }
  } while( true );
}

Assistant:

bool SimpSolver::backwardSubsumptionCheck(bool verbose)
{
    int cnt = 0;
    int subsumed = 0;
    int deleted_literals = 0;
    assert(decisionLevel() == 0);

    while (subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()){

        // Empty subsumption queue and return immediately on user-interrupt:
        if (asynch_interrupt){
            subsumption_queue.clear();
            bwdsub_assigns = trail.size();
            break; }

        // Check top-level assignments by creating a dummy clause and placing it in the queue:
        if (subsumption_queue.size() == 0 && bwdsub_assigns < trail.size()){
            Lit l = trail[bwdsub_assigns++];
            ca[bwdsub_tmpunit][0] = l;
            ca[bwdsub_tmpunit].calcAbstraction();
            subsumption_queue.insert(bwdsub_tmpunit); }

        CRef    cr = subsumption_queue.peek(); subsumption_queue.pop();
        Clause& c  = ca[cr];

        if (c.mark()) continue;

        if (verbose && verbosity >= 2 && cnt++ % 1000 == 0)
            printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r", subsumption_queue.size(), subsumed, deleted_literals);

        assert(c.size() > 1 || value(c[0]) == l_True);    // Unit-clauses should have been propagated before this point.

        // Find best variable to scan:
        Var best = var(c[0]);
        for (int i = 1; i < c.size(); i++)
            if (occurs[var(c[i])].size() < occurs[best].size())
                best = var(c[i]);

        // Search all candidates:
        vec<CRef>& _cs = occurs.lookup(best);
        CRef*       cs = (CRef*)_cs;

        for (int j = 0; j < _cs.size(); j++)
            if (c.mark())
                break;
            else if (!ca[cs[j]].mark() &&  cs[j] != cr && (subsumption_lim == -1 || ca[cs[j]].size() < subsumption_lim)){
                Lit l = c.subsumes(ca[cs[j]]);

                if (l == lit_Undef)
                    subsumed++, removeClause(cs[j]);
                else if (l != lit_Error){
                    deleted_literals++;

                    if (!strengthenClause(cs[j], ~l))
                        return false;

                    // Did current candidate get deleted from cs? Then check candidate at index j again:
                    if (var(l) == best)
                        j--;
                }
            }
    }

    return true;
}